

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall
foxxll::disk_config::disk_config
          (disk_config *this,string *_path,external_size_type _size,string *_io_impl)

{
  pointer pcVar1;
  
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _path->_M_string_length);
  this->size = _size;
  (this->io_impl)._M_dataplus._M_p = (pointer)&(this->io_impl).field_2;
  pcVar1 = (_io_impl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->io_impl,pcVar1,pcVar1 + _io_impl->_M_string_length);
  this->autogrow = true;
  this->delete_on_exit = false;
  this->direct = DIRECT_TRY;
  this->flash = false;
  this->queue = -1;
  this->device_id = 0xffffffff;
  this->raw_device = false;
  this->unlink_on_open = false;
  this->queue_length = 0;
  parse_fileio(this);
  return;
}

Assistant:

disk_config::disk_config(const std::string& _path, external_size_type _size,
                         const std::string& _io_impl)
    : path(_path),
      size(_size),
      io_impl(_io_impl),
      autogrow(true),
      delete_on_exit(false),
      direct(DIRECT_TRY),
      flash(false),
      queue(file::DEFAULT_QUEUE),
      device_id(file::DEFAULT_DEVICE_ID),
      raw_device(false),
      unlink_on_open(false),
      queue_length(0)
{
    parse_fileio();
}